

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase710::run(TestCase710 *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  uint uVar2;
  Type *func;
  Type *func_00;
  bool local_771;
  undefined1 local_770 [7];
  bool _kj_shouldLog_9;
  bool local_739;
  undefined1 local_738 [7];
  bool _kj_shouldLog_8;
  bool local_701;
  undefined1 local_700 [7];
  bool _kj_shouldLog_7;
  bool local_6c9;
  undefined1 local_6c8 [7];
  bool _kj_shouldLog_6;
  uint local_698;
  uint local_694;
  Fault local_690;
  Fault f_1;
  undefined1 local_668 [8];
  ReaderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>_> l_1;
  undefined1 *puStack_630;
  bool _kj_shouldLog_5;
  Maybe<kj::Exception> local_628;
  undefined1 local_4c8 [8];
  Reader reader;
  undefined1 local_490 [7];
  bool _kj_shouldLog_4;
  bool local_461;
  undefined1 local_460 [7];
  bool _kj_shouldLog_3;
  bool local_431;
  undefined1 local_430 [7];
  bool _kj_shouldLog_2;
  bool local_401;
  undefined1 local_400 [7];
  bool _kj_shouldLog_1;
  uint local_3d8;
  uint local_3d4;
  Fault local_3d0;
  Fault f;
  undefined1 local_3b0 [8];
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>_> l;
  undefined1 *puStack_380;
  bool _kj_shouldLog;
  Maybe<kj::Exception> local_378;
  Builder local_218;
  Builder local_1f0;
  Builder local_1c8;
  Builder local_1a0;
  Builder local_178;
  undefined1 local_160 [8];
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct1c>_> list;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase710 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_178,(Builder *)local_128);
  AnyPointer::Builder::
  initAs<capnp::List<capnproto_test::capnp::test::TestLists::Struct1c,(capnp::Kind)3>>
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct1c>_> *)local_160
             ,&local_178,4);
  List<capnproto_test::capnp::test::TestLists::Struct1c,_(capnp::Kind)3>::Builder::operator[]
            (&local_1a0,(Builder *)local_160,0);
  capnproto_test::capnp::test::TestLists::Struct1c::Builder::setF(&local_1a0,true);
  List<capnproto_test::capnp::test::TestLists::Struct1c,_(capnp::Kind)3>::Builder::operator[]
            (&local_1c8,(Builder *)local_160,1);
  capnproto_test::capnp::test::TestLists::Struct1c::Builder::setF(&local_1c8,false);
  List<capnproto_test::capnp::test::TestLists::Struct1c,_(capnp::Kind)3>::Builder::operator[]
            (&local_1f0,(Builder *)local_160,2);
  capnproto_test::capnp::test::TestLists::Struct1c::Builder::setF(&local_1f0,true);
  List<capnproto_test::capnp::test::TestLists::Struct1c,_(capnp::Kind)3>::Builder::operator[]
            (&local_218,(Builder *)local_160,3);
  capnproto_test::capnp::test::TestLists::Struct1c::Builder::setF(&local_218,true);
  puStack_380 = local_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase710::run()::__0>
            (&local_378,(kj *)&stack0xfffffffffffffc80,func);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_378,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_378);
  if (!bVar1) {
    l.builder._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (l.builder._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2d2,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
                );
      l.builder._39_1_ = 0;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&f,(Builder *)local_128);
  AnyPointer::Builder::
  getAs<capnp::List<capnproto_test::capnp::test::TestLists::Struct1,(capnp::Kind)3>>
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>_>
              *)local_3b0,(Builder *)&f);
  uVar2 = List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::size
                    ((Builder *)local_3b0);
  if (uVar2 != 4) {
    local_3d4 = 4;
    local_3d8 = List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::size
                          ((Builder *)local_3b0);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_3d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2d6,FAILED,"(4u) == (l.size())","4u, l.size()",&local_3d4,&local_3d8);
    kj::_::Debug::Fault::fatal(&local_3d0);
  }
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_400,(Builder *)local_3b0,0);
  bVar1 = capnproto_test::capnp::test::TestLists::Struct1::Builder::getF((Builder *)local_400);
  if (!bVar1) {
    local_401 = kj::_::Debug::shouldLog(ERROR);
    while (local_401 != false) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2d7,ERROR,"\"failed: expected \" \"l[0].getF()\"",
                 (char (*) [29])"failed: expected l[0].getF()");
      local_401 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_430,(Builder *)local_3b0,1);
  bVar1 = capnproto_test::capnp::test::TestLists::Struct1::Builder::getF((Builder *)local_430);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_431 = kj::_::Debug::shouldLog(ERROR);
    while (local_431 != false) {
      kj::_::Debug::log<char_const(&)[32]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2d8,ERROR,"\"failed: expected \" \"!(l[1].getF())\"",
                 (char (*) [32])"failed: expected !(l[1].getF())");
      local_431 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_460,(Builder *)local_3b0,2);
  bVar1 = capnproto_test::capnp::test::TestLists::Struct1::Builder::getF((Builder *)local_460);
  if (!bVar1) {
    local_461 = kj::_::Debug::shouldLog(ERROR);
    while (local_461 != false) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2d9,ERROR,"\"failed: expected \" \"l[2].getF()\"",
                 (char (*) [29])"failed: expected l[2].getF()");
      local_461 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_490,(Builder *)local_3b0,3);
  bVar1 = capnproto_test::capnp::test::TestLists::Struct1::Builder::getF((Builder *)local_490);
  if (!bVar1) {
    reader._reader._47_1_ = kj::_::Debug::shouldLog(ERROR);
    while (reader._reader._47_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2da,ERROR,"\"failed: expected \" \"l[3].getF()\"",
                 (char (*) [29])"failed: expected l[3].getF()");
      reader._reader._47_1_ = 0;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader
            ((Reader *)local_4c8,(Builder *)local_128);
  puStack_630 = local_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase710::run()::__1>
            (&local_628,(kj *)&stack0xfffffffffffff9d0,func_00);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_628,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_628);
  if (!bVar1) {
    l_1.reader._47_1_ = kj::_::Debug::shouldLog(ERROR);
    while (l_1.reader._47_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2df,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
                );
      l_1.reader._47_1_ = 0;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField
            ((Reader *)&f_1,(Reader *)local_4c8);
  AnyPointer::Reader::
  getAs<capnp::List<capnproto_test::capnp::test::TestLists::Struct1,(capnp::Kind)3>>
            ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>_>
              *)local_668,(Reader *)&f_1);
  uVar2 = List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Reader::size
                    ((Reader *)local_668);
  if (uVar2 != 4) {
    local_694 = 4;
    local_698 = List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Reader::size
                          ((Reader *)local_668);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_690,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2e3,FAILED,"(4u) == (l.size())","4u, l.size()",&local_694,&local_698);
    kj::_::Debug::Fault::fatal(&local_690);
  }
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_6c8,(Reader *)local_668,0);
  bVar1 = capnproto_test::capnp::test::TestLists::Struct1::Reader::getF((Reader *)local_6c8);
  if (!bVar1) {
    local_6c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_6c9 != false) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2e4,ERROR,"\"failed: expected \" \"l[0].getF()\"",
                 (char (*) [29])"failed: expected l[0].getF()");
      local_6c9 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_700,(Reader *)local_668,1);
  bVar1 = capnproto_test::capnp::test::TestLists::Struct1::Reader::getF((Reader *)local_700);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_701 = kj::_::Debug::shouldLog(ERROR);
    while (local_701 != false) {
      kj::_::Debug::log<char_const(&)[32]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2e5,ERROR,"\"failed: expected \" \"!(l[1].getF())\"",
                 (char (*) [32])"failed: expected !(l[1].getF())");
      local_701 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_738,(Reader *)local_668,2);
  bVar1 = capnproto_test::capnp::test::TestLists::Struct1::Reader::getF((Reader *)local_738);
  if (!bVar1) {
    local_739 = kj::_::Debug::shouldLog(ERROR);
    while (local_739 != false) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2e6,ERROR,"\"failed: expected \" \"l[2].getF()\"",
                 (char (*) [29])"failed: expected l[2].getF()");
      local_739 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_770,(Reader *)local_668,3);
  bVar1 = capnproto_test::capnp::test::TestLists::Struct1::Reader::getF((Reader *)local_770);
  if (!bVar1) {
    local_771 = kj::_::Debug::shouldLog(ERROR);
    while (local_771 != false) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2e7,ERROR,"\"failed: expected \" \"l[3].getF()\"",
                 (char (*) [29])"failed: expected l[3].getF()");
      local_771 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Encoding, BitListDowngradeFromStruct) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  {
    auto list = root.getAnyPointerField().initAs<List<test::TestLists::Struct1c>>(4);
    list[0].setF(true);
    list[1].setF(false);
    list[2].setF(true);
    list[3].setF(true);
  }

  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());

  {
    auto l = root.getAnyPointerField().getAs<List<test::TestLists::Struct1>>();
    ASSERT_EQ(4u, l.size());
    EXPECT_TRUE(l[0].getF());
    EXPECT_FALSE(l[1].getF());
    EXPECT_TRUE(l[2].getF());
    EXPECT_TRUE(l[3].getF());
  }

  auto reader = root.asReader();

  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());

  {
    auto l = reader.getAnyPointerField().getAs<List<test::TestLists::Struct1>>();
    ASSERT_EQ(4u, l.size());
    EXPECT_TRUE(l[0].getF());
    EXPECT_FALSE(l[1].getF());
    EXPECT_TRUE(l[2].getF());
    EXPECT_TRUE(l[3].getF());
  }
}